

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O1

int ConnectRazorAHRSx(RAZORAHRS *pRazorAHRS,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsRazorAHRS[lVar2] == (void *)0x0) {
      iVar1 = ConnectRazorAHRS(pRazorAHRS,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsRazorAHRS[lVar2] = pRazorAHRS;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectRazorAHRSx(RAZORAHRS* pRazorAHRS, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRazorAHRS[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectRazorAHRS(pRazorAHRS, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsRazorAHRS[id] = pRazorAHRS;

	return EXIT_SUCCESS;
}